

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprAddFunctionOrderBy(Parse *pParse,Expr *pExpr,ExprList *pOrderBy)

{
  long lVar1;
  Vdbe *pVVar2;
  ExprList *in_RDX;
  Parse *in_RSI;
  undefined8 *in_RDI;
  sqlite3 *db;
  Expr *pOB;
  Expr *p;
  sqlite3 *db_00;
  
  db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  p = (Expr *)*in_RDI;
  if (in_RDX != (ExprList *)0x0) {
    if (in_RSI == (Parse *)0x0) {
      sqlite3ExprListDelete((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,(ExprList *)p);
    }
    else {
      lVar1._0_1_ = in_RSI->isMultiWrite;
      lVar1._1_1_ = in_RSI->mayAbort;
      lVar1._2_1_ = in_RSI->hasCompound;
      lVar1._3_1_ = in_RSI->okConstFactor;
      lVar1._4_1_ = in_RSI->disableLookaside;
      lVar1._5_1_ = in_RSI->prepFlags;
      lVar1._6_1_ = in_RSI->withinRJSubrtn;
      lVar1._7_1_ = in_RSI->bHasWith;
      if ((lVar1 == 0) || (**(int **)&in_RSI->isMultiWrite == 0)) {
        sqlite3ParserAddCleanup
                  (in_RSI,(_func_void_sqlite3_ptr_void_ptr *)in_RDX,&DAT_aaaaaaaaaaaaaaaa);
      }
      else if ((((ulong)in_RSI->db & 0x100000000000000) == 0) ||
              (*(char *)(*(long *)&in_RSI->szOpAlloc + 0x20) == -0x59)) {
        pVVar2 = (Vdbe *)sqlite3ExprAlloc(db,(int)((ulong)in_RDI >> 0x20),(Token *)in_RSI,
                                          (int)((ulong)in_RDX >> 0x20));
        if (pVVar2 == (Vdbe *)0x0) {
          sqlite3ExprListDelete((sqlite3 *)0x0,(ExprList *)p);
        }
        else {
          ((anon_union_8_2_a01b6dbf_for_x *)&pVVar2->nVar)->pList = in_RDX;
          in_RSI->pVdbe = pVVar2;
          *(u32 *)((long)&pVVar2->db + 4) = *(u32 *)((long)&pVVar2->db + 4) | 0x20000;
        }
      }
      else {
        sqlite3ExprOrderByAggregateError((Parse *)&DAT_aaaaaaaaaaaaaaaa,p);
        sqlite3ExprListDelete(db_00,(ExprList *)p);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAddFunctionOrderBy(
  Parse *pParse,        /* Parsing context */
  Expr *pExpr,          /* The function call to which ORDER BY is to be added */
  ExprList *pOrderBy    /* The ORDER BY clause to add */
){
  Expr *pOB;
  sqlite3 *db = pParse->db;
  if( NEVER(pOrderBy==0) ){
    assert( db->mallocFailed );
    return;
  }
  if( pExpr==0 ){
    assert( db->mallocFailed );
    sqlite3ExprListDelete(db, pOrderBy);
    return;
  }
  assert( pExpr->op==TK_FUNCTION );
  assert( pExpr->pLeft==0 );
  assert( ExprUseXList(pExpr) );
  if( pExpr->x.pList==0 || NEVER(pExpr->x.pList->nExpr==0) ){
    /* Ignore ORDER BY on zero-argument aggregates */
    sqlite3ParserAddCleanup(pParse, sqlite3ExprListDeleteGeneric, pOrderBy);
    return;
  }
  if( IsWindowFunc(pExpr) ){
    sqlite3ExprOrderByAggregateError(pParse, pExpr);
    sqlite3ExprListDelete(db, pOrderBy);
    return;
  }

  pOB = sqlite3ExprAlloc(db, TK_ORDER, 0, 0);
  if( pOB==0 ){
    sqlite3ExprListDelete(db, pOrderBy);
    return;
  }
  pOB->x.pList = pOrderBy;
  assert( ExprUseXList(pOB) );
  pExpr->pLeft = pOB;
  ExprSetProperty(pOB, EP_FullSize);
}